

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O1

int anon_unknown.dwarf_23d32::Choose(int n)

{
  int *piVar1;
  __pid_t _Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long *plVar6;
  long *plVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint unaff_R15D;
  uint uVar12;
  bool bVar13;
  size_type *local_78;
  string __str;
  long local_48;
  long lStack_40;
  uint local_34;
  
  if (n < 1) {
    die("n > 0 failed at line __LINE__");
  }
  local_34 = n - 1;
  bVar13 = n != 1;
  if (bVar13) {
    uVar9 = 0;
    do {
      plVar6 = (anonymous_namespace)::Shmem;
      if ((char)(anonymous_namespace)::Shmem[0x292] == '\x01') {
LAB_00262460:
        pthread_mutex_unlock((pthread_mutex_t *)(plVar6 + 1));
        exit(-1);
      }
      _Var2 = fork();
      iVar4 = (anonymous_namespace)::Depth;
      if (_Var2 == -1) {
        die("fork failed");
      }
      if (_Var2 == 0) {
        LOCK();
        (anonymous_namespace)::Id = *(anonymous_namespace)::Shmem;
        *(anonymous_namespace)::Shmem = *(anonymous_namespace)::Shmem + 1;
        UNLOCK();
        uVar10 = 1;
        if (9 < uVar9) {
          uVar8 = (ulong)uVar9;
          uVar12 = 4;
          do {
            uVar10 = uVar12;
            uVar5 = (uint)uVar8;
            if (uVar5 < 100) {
              uVar10 = uVar10 - 2;
              goto LAB_00262226;
            }
            if (uVar5 < 1000) {
              uVar10 = uVar10 - 1;
              goto LAB_00262226;
            }
            if (uVar5 < 10000) goto LAB_00262226;
            uVar8 = uVar8 / 10000;
            uVar12 = uVar10 + 4;
          } while (99999 < uVar5);
          uVar10 = uVar10 + 1;
        }
LAB_00262226:
        local_78 = &__str._M_string_length;
        std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar10);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,uVar10,uVar9);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_48 = *plVar7;
          lStack_40 = plVar6[3];
          __str.field_2._8_8_ = &local_48;
        }
        else {
          local_48 = *plVar7;
          __str.field_2._8_8_ = (long *)*plVar6;
        }
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((anonymous_namespace)::Choices_abi_cxx11_,__str.field_2._8_8_);
        if ((long *)__str.field_2._8_8_ != &local_48) {
          operator_delete((void *)__str.field_2._8_8_,local_48 + 1);
        }
        if (local_78 != &__str._M_string_length) {
          operator_delete(local_78,__str._M_string_length + 1);
        }
        (anonymous_namespace)::Depth = (anonymous_namespace)::Depth + 1;
        uVar10 = getpid();
        srand(uVar10);
        unaff_R15D = uVar9;
      }
      else {
        lVar11 = (long)(anonymous_namespace)::Depth;
        iVar3 = pthread_mutex_lock((pthread_mutex_t *)((anonymous_namespace)::Shmem + 1));
        if (iVar3 != 0) {
          die("lock failed");
        }
        if (99 < iVar4) {
          die("oops, you\'ll need to rebuild opt-fuzz with a larger MAX_DEPTH");
        }
        if ((int)(anonymous_namespace)::Cores._128_4_ <
            *(int *)((long)(anonymous_namespace)::Shmem + 0x148c)) {
          die("Shmem->Running <= Cores failed at line __LINE__");
        }
        while (plVar6 = (anonymous_namespace)::Shmem,
              (int)(anonymous_namespace)::Cores._128_4_ <=
              *(int *)((long)(anonymous_namespace)::Shmem + 0x148c)) {
          piVar1 = (int *)((long)(anonymous_namespace)::Shmem + lVar11 * 4 + 0x12f8);
          *piVar1 = *piVar1 + 1;
          if ((char)plVar6[0x292] == '\x01') goto LAB_00262460;
          iVar4 = pthread_cond_wait((pthread_cond_t *)(plVar6 + lVar11 * 6 + 7),
                                    (pthread_mutex_t *)(plVar6 + 1));
          if (iVar4 != 0) {
            die("pthread_cond_wait failed");
          }
          plVar6 = (anonymous_namespace)::Shmem;
          if ((char)(anonymous_namespace)::Shmem[0x292] == '\x01') goto LAB_00262460;
        }
        *(int *)((long)(anonymous_namespace)::Shmem + 0x148c) =
             *(int *)((long)(anonymous_namespace)::Shmem + 0x148c) + 1;
        iVar4 = pthread_mutex_unlock((pthread_mutex_t *)(plVar6 + 1));
        if (iVar4 != 0) {
          die("unlock failed");
        }
        waitpid(-1,(int *)0x0,1);
      }
      if (_Var2 == 0) break;
      uVar9 = uVar9 + 1;
      bVar13 = (int)uVar9 < (int)local_34;
    } while (uVar9 != local_34);
  }
  if (!bVar13) {
    uVar9 = -local_34;
    if (0 < (int)local_34) {
      uVar9 = local_34;
    }
    uVar10 = 1;
    if (9 < uVar9) {
      uVar8 = (ulong)uVar9;
      uVar12 = 4;
      do {
        uVar10 = uVar12;
        uVar5 = (uint)uVar8;
        if (uVar5 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_00262376;
        }
        if (uVar5 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_00262376;
        }
        if (uVar5 < 10000) goto LAB_00262376;
        uVar8 = uVar8 / 10000;
        uVar12 = uVar10 + 4;
      } while (99999 < uVar5);
      uVar10 = uVar10 + 1;
    }
LAB_00262376:
    uVar12 = local_34 >> 0x1f;
    local_78 = &__str._M_string_length;
    std::__cxx11::string::_M_construct
              ((ulong)&local_78,(char)uVar10 - (char)((int)local_34 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)uVar12 + (long)local_78),uVar10,uVar9);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_48 = *plVar7;
      lStack_40 = plVar6[3];
      __str.field_2._8_8_ = &local_48;
    }
    else {
      local_48 = *plVar7;
      __str.field_2._8_8_ = (long *)*plVar6;
    }
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((anonymous_namespace)::Choices_abi_cxx11_,__str.field_2._8_8_);
    if ((long *)__str.field_2._8_8_ != &local_48) {
      operator_delete((void *)__str.field_2._8_8_,local_48 + 1);
    }
    unaff_R15D = local_34;
    if (local_78 != &__str._M_string_length) {
      operator_delete(local_78,__str._M_string_length + 1);
      unaff_R15D = local_34;
    }
  }
  return unaff_R15D;
}

Assistant:

int Choose(int n) {
  assert(n > 0);
  for (int i = 0; i < (n - 1); ++i) {
    if (Shmem->Stop) {
      pthread_mutex_unlock(&Shmem->Lock);
      exit(-1);
    }
    int ret = ::fork();
    if (ret == -1)
      die("fork failed");
    if (ret == 0) {
      // child
      Id = Shmem->NextId.fetch_add(1);
      Choices += std::to_string(i) + " ";
      ++Depth;
      ::srand(::getpid());
      return i;
    }
    // parent
    increase_runners(Depth);
    waitpid(-1, 0, WNOHANG);
  }
  Choices += std::to_string(n - 1) + " ";
  return n - 1;
}